

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

int __thiscall despot::TabularCPT::ComputeIndex(TabularCPT *this,int pid,double *sum)

{
  double dVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  int local_3c;
  int cur;
  pair<int,_double> *pair;
  int i;
  double *sum_local;
  int pid_local;
  TabularCPT *this_local;
  
  sVar2 = std::
          vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
          ::size(&this->sparse_values_);
  if (sVar2 == 0) {
    local_3c = 0;
    while( true ) {
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&(this->super_CPT).super_Function.values_,(long)pid);
      sVar2 = std::vector<double,_std::allocator<double>_>::size(pvVar5);
      if (sVar2 <= (ulong)(long)local_3c) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/pomdpx/parser/function.cpp"
                      ,0x16d,"virtual int despot::TabularCPT::ComputeIndex(int, double &) const");
      }
      dVar1 = *sum;
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&(this->super_CPT).super_Function.values_,(long)pid);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_3c);
      if (dVar1 < *pvVar6) break;
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&(this->super_CPT).super_Function.values_,(long)pid);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_3c);
      *sum = *sum - *pvVar6;
      local_3c = local_3c + 1;
    }
    pvVar5 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&(this->super_CPT).super_Function.values_,(long)pid);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_3c);
    *sum = *sum / (*pvVar6 * 1.000000001);
    this_local._4_4_ = local_3c;
  }
  else {
    pair._4_4_ = 0;
    while( true ) {
      pvVar3 = std::
               vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ::operator[](&this->sparse_values_,(long)pid);
      sVar2 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                        (pvVar3);
      if (sVar2 <= (ulong)(long)pair._4_4_) break;
      pvVar3 = std::
               vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ::operator[](&this->sparse_values_,(long)pid);
      pvVar4 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
               operator[](pvVar3,(long)pair._4_4_);
      if (*sum < pvVar4->second) {
        *sum = *sum / (pvVar4->second * 1.000000001);
        return pvVar4->first;
      }
      *sum = *sum - pvVar4->second;
      pair._4_4_ = pair._4_4_ + 1;
    }
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int TabularCPT::ComputeIndex(int pid, double& sum) const {
	if (sparse_values_.size() != 0) {
		for (int i = 0; i < sparse_values_[pid].size(); i++) {
			const pair<int, double>& pair = sparse_values_[pid][i];
			if (sum < pair.second) {
				sum /= pair.second * (1 + 1E-9);
				return pair.first;
			}
			sum -= pair.second;
		}
		return -1;
	} else {
		for (int cur = 0; cur < values_[pid].size(); cur++) {
			if (sum < values_[pid][cur]) {
				sum /= values_[pid][cur] * (1 + 1E-9);
				return cur;
			}
			sum -= values_[pid][cur];
		}
	}

	assert(false);
	return -1;
}